

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase433::run(TestCase433 *this)

{
  Own<int,_MyDisposer> ptr;
  DebugComparison<int_*&,_std::nullptr_t> _kjCondition;
  int i;
  
  _kjCondition.right = (void *)0x0;
  _kjCondition.result = run::disposedPtr == (int *)0x0;
  _kjCondition.left = &run::disposedPtr;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  ptr.ptr = &i;
  if ((!_kjCondition.result) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[40],kj::_::DebugComparison<int*&,decltype(nullptr)>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x1be,ERROR,"\"failed: expected \" \"disposedPtr == nullptr\", _kjCondition",
               (char (*) [40])"failed: expected disposedPtr == nullptr",&_kjCondition);
  }
  Own<int,_MyDisposer>::~Own(&ptr);
  _kjCondition.left = &run::disposedPtr;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.result = run::disposedPtr == &i;
  _kjCondition.op.content.size_ = 5;
  _kjCondition.right = &i;
  if ((!_kjCondition.result) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[35],kj::_::DebugComparison<int*&,int*>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x1c0,ERROR,"\"failed: expected \" \"disposedPtr == &i\", _kjCondition",
               (char (*) [35])"failed: expected disposedPtr == &i",
               (DebugComparison<int_*&,_int_*> *)&_kjCondition);
  }
  run::disposedPtr = (int *)0x0;
  _kjCondition.left = (int **)0x0;
  ptr.ptr = &i;
  Own<int,_MyDisposer>::~Own(&ptr);
  Own<int,_MyDisposer>::~Own((Own<int,_MyDisposer> *)&_kjCondition);
  _kjCondition.left = &run::disposedPtr;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.result = run::disposedPtr == &i;
  _kjCondition.op.content.size_ = 5;
  _kjCondition.right = &i;
  if ((!_kjCondition.result) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[35],kj::_::DebugComparison<int*&,int*>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x1c9,ERROR,"\"failed: expected \" \"disposedPtr == &i\", _kjCondition",
               (char (*) [35])"failed: expected disposedPtr == &i",
               (DebugComparison<int_*&,_int_*> *)&_kjCondition);
  }
  run::disposedPtr = (int *)0x0;
  _kjCondition.left = (int **)0x0;
  ptr.ptr = &i;
  Own<int,_MyDisposer>::~Own((Own<int,_MyDisposer> *)&_kjCondition);
  _kjCondition.right = (void *)0x0;
  _kjCondition.result = run::disposedPtr == (int *)0x0;
  _kjCondition.left = &run::disposedPtr;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[40],kj::_::DebugComparison<int*&,decltype(nullptr)>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x1d4,ERROR,"\"failed: expected \" \"disposedPtr == nullptr\", _kjCondition",
               (char (*) [40])"failed: expected disposedPtr == nullptr",&_kjCondition);
  }
  Own<int,_MyDisposer>::~Own(&ptr);
  _kjCondition.left = &run::disposedPtr;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.result = run::disposedPtr == &i;
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (_::Debug::minSeverity < 3)) {
    _kjCondition.right = &i;
    _::Debug::log<char_const(&)[35],kj::_::DebugComparison<int*&,int*>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x1d6,ERROR,"\"failed: expected \" \"disposedPtr == &i\", _kjCondition",
               (char (*) [35])"failed: expected disposedPtr == &i",
               (DebugComparison<int_*&,_int_*> *)&_kjCondition);
  }
  return;
}

Assistant:

static void dispose(int* value) {
      KJ_EXPECT(disposedPtr == nullptr);
      disposedPtr = value;
    }